

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O2

void Fl_Image::labeltype(Fl_Label *lo,int lx,int ly,int lw,int lh,Fl_Align la)

{
  long *plVar1;
  long lVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  int iVar4;
  int iVar5;
  
  uVar3 = CONCAT44(in_register_00000014,ly);
  plVar1 = (long *)lo->value;
  iVar5 = 0;
  iVar4 = 0;
  if (((la & 4) == 0) && (iVar4 = (int)plVar1[1] - lw, (la & 8) == 0)) {
    lVar2 = (long)iVar4;
    iVar4 = iVar4 / 2;
    uVar3 = lVar2 % 2 & 0xffffffff;
  }
  if (((la & 1) == 0) && (iVar5 = *(int *)((long)plVar1 + 0xc) - lh, (la & 2) == 0)) {
    lVar2 = (long)iVar5;
    iVar5 = iVar5 / 2;
    uVar3 = lVar2 % 2 & 0xffffffff;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)lo->color,uVar3);
  (**(code **)(*plVar1 + 0x38))(plVar1,lx,ly,lw,lh,iVar4,iVar5);
  return;
}

Assistant:

void
Fl_Image::labeltype(const Fl_Label *lo,		// I - Label
                    int            lx,		// I - X position
		    int            ly,		// I - Y position
		    int            lw,		// I - Width of label
		    int            lh,		// I - Height of label
		    Fl_Align       la) {	// I - Alignment
  Fl_Image	*img;				// Image pointer
  int		cx, cy;				// Image position

  img = (Fl_Image *)(lo->value);

  if (la & FL_ALIGN_LEFT) cx = 0;
  else if (la & FL_ALIGN_RIGHT) cx = img->w() - lw;
  else cx = (img->w() - lw) / 2;

  if (la & FL_ALIGN_TOP) cy = 0;
  else if (la & FL_ALIGN_BOTTOM) cy = img->h() - lh;
  else cy = (img->h() - lh) / 2;

  fl_color((Fl_Color)lo->color);

  img->draw(lx, ly, lw, lh, cx, cy);
}